

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O3

void telnet_ttype_is(telnet_t *telnet,char *ttype)

{
  undefined8 in_RAX;
  size_t size;
  undefined8 uStack_18;
  
  if (ttype == (char *)0x0) {
    ttype = "NVT";
  }
  uStack_18 = in_RAX;
  _send(telnet,(char *)telnet_ttype_is::IS,4);
  size = strlen(ttype);
  _send(telnet,ttype,size);
  uStack_18 = CONCAT26(0xf0ff,(undefined6)uStack_18);
  _send(telnet,(char *)((long)&uStack_18 + 6),2);
  return;
}

Assistant:

void telnet_ttype_is(telnet_t *telnet, const char* ttype) {
	static const unsigned char IS[] = { TELNET_IAC, TELNET_SB,
			TELNET_TELOPT_TTYPE, TELNET_TTYPE_IS };
	if (!ttype) {
		ttype = "NVT";
	}
	_sendu(telnet, IS, sizeof(IS));
	_send(telnet, ttype, strlen(ttype));
	telnet_finish_sb(telnet);
}